

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-pipe.c
# Opt level: O3

int rops_handle_POLLIN_pipe(lws_context_per_thread *pt,lws *wsi,pollfd *pollfd)

{
  int iVar1;
  int iVar2;
  eventfd_t value;
  eventfd_t eStack_18;
  
  iVar1 = eventfd_read((wsi->desc).sockfd,&eStack_18);
  iVar2 = 6;
  if (-1 < iVar1) {
    iVar1 = lws_broadcast(pt,0x47,(void *)0x0,0);
    if (iVar1 == 0) {
      iVar2 = 5;
    }
    else {
      _lws_log(8,"closed in event cancel\n");
    }
  }
  return iVar2;
}

Assistant:

static int
rops_handle_POLLIN_pipe(struct lws_context_per_thread *pt, struct lws *wsi,
			struct lws_pollfd *pollfd)
{
#if defined(LWS_HAVE_EVENTFD)
	eventfd_t value;
	if (eventfd_read(wsi->desc.sockfd, &value) < 0)
		return LWS_HPI_RET_PLEASE_CLOSE_ME;
#elif !defined(WIN32) && !defined(_WIN32)
	char s[100];
	int n;

	/*
	 * discard the byte(s) that signaled us
	 * We really don't care about the number of bytes, but coverity
	 * thinks we should.
	 */
	n = read(wsi->desc.sockfd, s, sizeof(s));
	(void)n;
	if (n < 0)
		return LWS_HPI_RET_PLEASE_CLOSE_ME;
#endif

#if defined(LWS_WITH_THREADPOOL)
	/*
	 * threadpools that need to call for on_writable callbacks do it by
	 * marking the task as needing one for its wsi, then cancelling service.
	 *
	 * Each tsi will call this to perform the actual callback_on_writable
	 * from the correct service thread context
	 */
	lws_threadpool_tsi_context(pt->context, pt->tid);
#endif

	/*
	 * the poll() wait, or the event loop for libuv etc is a
	 * process-wide resource that we interrupted.  So let every
	 * protocol that may be interested in the pipe event know that
	 * it happened.
	 */
	if (lws_broadcast(pt, LWS_CALLBACK_EVENT_WAIT_CANCELLED, NULL, 0)) {
		lwsl_info("closed in event cancel\n");
		return LWS_HPI_RET_PLEASE_CLOSE_ME;
	}

	return LWS_HPI_RET_HANDLED;
}